

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find.hpp
# Opt level: O2

iterator * __thiscall
trial::dynamic::value::find<std::allocator<char>,char16_t[9]>
          (iterator *__return_storage_ptr__,value *this,basic_variable<std::allocator<char>_> *self,
          char16_t (*other) [9])

{
  bool bVar1;
  value vVar2;
  reference lhs;
  iterator iStack_48;
  
  vVar2 = basic_variable<std::allocator<char>_>::symbol
                    ((basic_variable<std::allocator<char>_> *)this);
  if (vVar2 - boolean < 7) {
    bVar1 = detail::
            operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char16_t[9],_void>
            ::equal((variable_type *)this,(char16_t *)self);
    if (bVar1) {
      basic_variable<std::allocator<char>_>::begin
                (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)this);
      return __return_storage_ptr__;
    }
  }
  else if (vVar2 - array < 2) {
    basic_variable<std::allocator<char>_>::begin
              (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)this);
    while( true ) {
      basic_variable<std::allocator<char>_>::end
                (&iStack_48,(basic_variable<std::allocator<char>_> *)this);
      bVar1 = basic_variable<std::allocator<char>_>::iterator::operator!=
                        (__return_storage_ptr__,&iStack_48);
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
      ::~small_union(&iStack_48.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current);
      if (!bVar1) break;
      lhs = basic_variable<std::allocator<char>_>::
            iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            ::value(&__return_storage_ptr__->
                     super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   );
      bVar1 = detail::
              operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char16_t[9],_void>
              ::equal(lhs,(char16_t *)self);
      if (bVar1) {
        return __return_storage_ptr__;
      }
      basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++(&__return_storage_ptr__->
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
    }
    detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
    ::~small_union(&(__return_storage_ptr__->
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    ).current);
  }
  basic_variable<std::allocator<char>_>::end
            (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)this);
  return __return_storage_ptr__;
}

Assistant:

auto find(basic_variable<Allocator>& self,
          const T& other) -> typename basic_variable<Allocator>::iterator
{
    switch (self.symbol())
    {
    case symbol::null:
        return self.end();

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? self.begin() : self.end();

    case symbol::array:
    case symbol::map:
        for (auto it = self.begin(); it != self.end(); ++it)
        {
            if (*it == other)
                return it;
        }
        return self.end();
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}